

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O3

SUNErrCode
SUNDataNode_SetData_InMem
          (SUNDataNode self,SUNMemoryType src_mem_type,SUNMemoryType node_mem_type,void *data,
          size_t data_stride,size_t data_bytes)

{
  SUNMemory src;
  SUNMemory data_mem_dst;
  SUNMemory local_38;
  
  src = SUNMemoryHelper_Wrap(*(SUNMemoryHelper *)((long)self->content + 8),data,src_mem_type);
  local_38 = (SUNMemory)0x0;
  SUNMemoryHelper_AllocStrided
            (*(SUNMemoryHelper *)((long)self->content + 8),&local_38,data_bytes,data_stride,
             node_mem_type,(void *)0x0);
  SUNMemoryHelper_Copy
            (*(SUNMemoryHelper *)((long)self->content + 8),local_38,src,data_bytes,(void *)0x0);
  SUNMemoryHelper_Dealloc(*(SUNMemoryHelper *)((long)self->content + 8),src,(void *)0x0);
  *(SUNMemory *)((long)self->content + 0x10) = local_38;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_SetData_InMem(SUNDataNode self, SUNMemoryType src_mem_type,
                                     SUNMemoryType node_mem_type, void* data,
                                     size_t data_stride, size_t data_bytes)
{
  SUNFunctionBegin(self->sunctx);

  /* Use the default queue for the memory helper */
  void* queue = NULL;

  SUNAssert(BASE_MEMBER(self, dtype) == SUNDATANODE_LEAF, SUN_ERR_ARG_WRONGTYPE);

  SUNMemory data_mem_src = SUNMemoryHelper_Wrap(IMPL_MEMBER(self, mem_helper),
                                                data, src_mem_type);
  SUNCheckLastErr();

  SUNMemory data_mem_dst = NULL;
  SUNCheckCall(SUNMemoryHelper_AllocStrided(IMPL_MEMBER(self, mem_helper),
                                            &data_mem_dst, data_bytes,
                                            data_stride, node_mem_type, queue));

  SUNCheckCall(SUNMemoryHelper_Copy(IMPL_MEMBER(self, mem_helper), data_mem_dst,
                                    data_mem_src, data_bytes, queue));

  SUNMemoryHelper_Dealloc(IMPL_MEMBER(self, mem_helper), data_mem_src, queue);

  IMPL_MEMBER(self, leaf_data) = data_mem_dst;

  return SUN_SUCCESS;
}